

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

MessageSizeCounts
capnp::_::WireHelpers::totalSize(SegmentReader *segment,WirePointer *ref,int nestingLimit)

{
  WirePointer *segment_00;
  bool bVar1;
  ElementSize EVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  Kind KVar5;
  WordCountN<17> WVar6;
  ElementCountN<29> i_00;
  BitsPerElementTableType BVar7;
  word *pwVar8;
  unsigned_short *puVar9;
  WordCount64 other;
  uint *puVar10;
  unsigned_long uVar11;
  MessageSizeCounts MVar12;
  Fault local_240;
  Fault f_8;
  Fault f_7;
  Iterator local_218;
  uint j;
  Iterator __end7;
  Iterator __begin7;
  Range<unsigned_int> *__range7;
  Iterator local_1f8;
  uint i_2;
  Iterator __end6;
  Iterator __begin6;
  Range<unsigned_int> *__range6;
  word *pos;
  WirePointerCount pointerCount;
  WordCount dataSize;
  Fault f_6;
  undefined1 local_1c0 [8];
  DebugComparison<unsigned_long_&,_unsigned_int_&> _kjCondition_6;
  unsigned_long actualSize;
  Fault f_5;
  Kind local_180;
  DebugExpression<capnp::_::WirePointer::Kind> local_17c;
  undefined1 local_178 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition_5;
  ListElementCount count_1;
  WirePointer *elementTag;
  Fault f_4;
  undefined1 auStack_138 [3];
  DebugExpression<bool> _kjCondition_4;
  WordCountN<29> wordCount;
  Iterator local_120;
  uint i_1;
  Iterator __end5;
  Iterator __begin5;
  Range<unsigned_int> *__range5;
  Fault f_3;
  DebugExpression<bool> _kjCondition_3;
  uint count;
  Fault f_2;
  DebugExpression<bool> _kjCondition_2;
  WordCount64 totalWords;
  uint local_d8;
  ushort local_ca;
  Iterator local_c8;
  Iterator local_c6;
  Range<unsigned_short> RStack_c4;
  unsigned_short i;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_short> *__range4;
  WirePointer *pointerSection;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  word *p;
  word *local_90;
  word *_p792;
  word *ptr;
  Fault local_70;
  Fault f;
  int *local_60;
  undefined1 local_58 [8];
  DebugComparison<int_&,_int> _kjCondition;
  WirePointer *pWStack_28;
  int nestingLimit_local;
  WirePointer *ref_local;
  SegmentReader *segment_local;
  MessageSizeCounts result;
  
  _kjCondition._36_4_ = nestingLimit;
  pWStack_28 = ref;
  ref_local = (WirePointer *)segment;
  memset(&segment_local,0,0x10);
  bVar1 = WirePointer::isNull(pWStack_28);
  if (!bVar1) {
    local_60 = (int *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                 (int *)&_kjCondition.field_0x24);
    f.exception._4_4_ = 0;
    kj::_::DebugExpression<int&>::operator>
              ((DebugComparison<int_&,_int> *)local_58,(DebugExpression<int&> *)&local_60,
               (int *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
    if (bVar1) {
      _kjCondition._36_4_ = _kjCondition._36_4_ + -1;
      pwVar8 = WirePointer::target(pWStack_28,(SegmentReader *)ref_local);
      followFars((WireHelpers *)&p,&stack0xffffffffffffffd8,pwVar8,(SegmentReader **)&ref_local);
      local_90 = kj::_::readMaybe<capnp::word_const>((Maybe<const_capnp::word_&> *)&p);
      if (local_90 != (word *)0x0) {
        _p792 = local_90;
        KVar5 = WirePointer::kind(pWStack_28);
        segment_00 = ref_local;
        pwVar8 = _p792;
        switch(KVar5) {
        case STRUCT:
          WVar6 = WirePointer::StructRef::wordSize(&(pWStack_28->field_1).structRef);
          f_1.exception._6_1_ = boundsCheck((SegmentReader *)segment_00,pwVar8,WVar6);
          f_1.exception._7_1_ =
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&f_1.exception + 6));
          bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                            ((DebugExpression *)((long)&f_1.exception + 7));
          if (bVar1) {
            WVar6 = WirePointer::StructRef::wordSize(&(pWStack_28->field_1).structRef);
            MessageSizeCounts::addWords((MessageSizeCounts *)&segment_local,(ulong)WVar6);
            pwVar8 = _p792;
            uVar3 = DirectWireValue<unsigned_short>::get(&(pWStack_28->field_1).structRef.dataSize);
            uVar4 = DirectWireValue<unsigned_short>::get(&(pWStack_28->field_1).structRef.ptrCount);
            RStack_c4 = kj::zeroTo<unsigned_short>(uVar4);
            ___end4 = &stack0xffffffffffffff3c;
            local_c6 = kj::Range<unsigned_short>::begin(___end4);
            local_c8 = kj::Range<unsigned_short>::end(___end4);
            while (bVar1 = kj::Range<unsigned_short>::Iterator::operator==(&local_c6,&local_c8),
                  ((bVar1 ^ 0xffU) & 1) != 0) {
              puVar9 = kj::Range<unsigned_short>::Iterator::operator*(&local_c6);
              local_ca = *puVar9;
              MVar12 = totalSize((SegmentReader *)ref_local,
                                 (WirePointer *)
                                 (pwVar8 + (long)(int)(uint)uVar3 + (long)(int)(uint)local_ca),
                                 _kjCondition._36_4_);
              totalWords = MVar12.wordCount;
              local_d8 = MVar12.capCount;
              MessageSizeCounts::operator+=
                        ((MessageSizeCounts *)&segment_local,(MessageSizeCounts *)&totalWords);
              kj::Range<unsigned_short>::Iterator::operator++(&local_c6);
            }
          }
          else {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[322]>
                      ((Fault *)&pointerSection,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x322,FAILED,"boundsCheck(segment, ptr, ref->structRef.wordSize())",
                       "_kjCondition,\"Message contained out-of-bounds struct pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)((long)&f_1.exception + 7),
                       (char (*) [322])
                       "Message contained out-of-bounds struct pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)&pointerSection);
          }
          break;
        case LIST:
          EVar2 = WirePointer::ListRef::elementSize(&(pWStack_28->field_1).listRef);
          switch(EVar2) {
          case VOID:
            break;
          case BIT:
          case BYTE:
          case TWO_BYTES:
          case FOUR_BYTES:
          case EIGHT_BYTES:
            i_00 = WirePointer::ListRef::elementCount(&(pWStack_28->field_1).listRef);
            uVar11 = upgradeBound<unsigned_long,unsigned_int>(i_00);
            EVar2 = WirePointer::ListRef::elementSize(&(pWStack_28->field_1).listRef);
            BVar7 = dataBitsPerElement(EVar2);
            other = roundBitsUpToWords(uVar11 * BVar7);
            f_2.exception._6_1_ =
                 boundsCheck((SegmentReader *)ref_local,_p792,(WordCountN<31>)other);
            f_2.exception._7_1_ =
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                            (bool *)((long)&f_2.exception + 6));
            bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                              ((DebugExpression *)((long)&f_2.exception + 7));
            if (bVar1) {
              MessageSizeCounts::addWords((MessageSizeCounts *)&segment_local,other);
            }
            else {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                        ((Fault *)&stack0xffffffffffffff08,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x33d,FAILED,"boundsCheck(segment, ptr, totalWords)",
                         "_kjCondition,\"Message contained out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                         ,(DebugExpression<bool> *)((long)&f_2.exception + 7),
                         (char (*) [320])
                         "Message contained out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                        );
              kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff08);
            }
            break;
          case POINTER:
            f_3.exception._4_4_ = WirePointer::ListRef::elementCount(&(pWStack_28->field_1).listRef)
            ;
            f_3.exception._2_1_ = boundsCheck((SegmentReader *)ref_local,_p792,f_3.exception._4_4_);
            f_3.exception._3_1_ =
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                            (bool *)((long)&f_3.exception + 2));
            bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                              ((DebugExpression *)((long)&f_3.exception + 3));
            if (bVar1) {
              MessageSizeCounts::addWords
                        ((MessageSizeCounts *)&segment_local,(ulong)f_3.exception._4_4_);
              ___end5 = kj::zeroTo<unsigned_int>(f_3.exception._4_4_);
              i_1 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end5);
              local_120 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end5);
              while (bVar1 = kj::Range<unsigned_int>::Iterator::operator==
                                       ((Iterator *)&i_1,&local_120), ((bVar1 ^ 0xffU) & 1) != 0) {
                puVar10 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_1);
                MVar12 = totalSize((SegmentReader *)ref_local,(WirePointer *)(_p792 + *puVar10),
                                   _kjCondition._36_4_);
                _auStack_138 = MVar12.wordCount;
                MessageSizeCounts::operator+=
                          ((MessageSizeCounts *)&segment_local,(MessageSizeCounts *)auStack_138);
                kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_1);
              }
            }
            else {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                        ((Fault *)&__range5,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x348,FAILED,"boundsCheck(segment, ptr, count * WORDS_PER_POINTER)",
                         "_kjCondition,\"Message contained out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                         ,(DebugExpression<bool> *)((long)&f_3.exception + 3),
                         (char (*) [320])
                         "Message contained out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                        );
              kj::_::Debug::Fault::~Fault((Fault *)&__range5);
            }
            break;
          case INLINE_COMPOSITE:
            f_4.exception._4_4_ =
                 WirePointer::ListRef::inlineCompositeWordCount(&(pWStack_28->field_1).listRef);
            f_4.exception._2_1_ =
                 boundsCheck((SegmentReader *)ref_local,_p792,f_4.exception._4_4_ + 1);
            f_4.exception._3_1_ =
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                            (bool *)((long)&f_4.exception + 2));
            bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                              ((DebugExpression *)((long)&f_4.exception + 3));
            pwVar8 = _p792;
            if (bVar1) {
              _kjCondition_5._28_4_ =
                   WirePointer::inlineCompositeListElementCount((WirePointer *)_p792);
              local_180 = WirePointer::kind((WirePointer *)pwVar8);
              local_17c = kj::_::DebugExpressionStart::operator<<
                                    ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_180);
              f_5.exception._4_4_ = 0;
              kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
                        ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                          *)local_178,&local_17c,(Kind *)((long)&f_5.exception + 4));
              bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_178);
              if (bVar1) {
                WVar6 = WirePointer::StructRef::wordSize((StructRef *)((long)&pwVar8->content + 4));
                uVar11 = upgradeBound<unsigned_long,unsigned_int>(_kjCondition_5._28_4_);
                _kjCondition_6._32_8_ = WVar6 * uVar11;
                f_6.exception =
                     (Exception *)
                     kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (unsigned_long *)&_kjCondition_6.result);
                kj::_::DebugExpression<unsigned_long&>::operator<=
                          ((DebugComparison<unsigned_long_&,_unsigned_int_&> *)local_1c0,
                           (DebugExpression<unsigned_long&> *)&f_6,
                           (uint *)((long)&f_4.exception + 4));
                bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c0);
                if (bVar1) {
                  MessageSizeCounts::addWords
                            ((MessageSizeCounts *)&segment_local,_kjCondition_6._32_8_ + 1);
                  uVar3 = DirectWireValue<unsigned_short>::get
                                    ((DirectWireValue<unsigned_short> *)((long)&pwVar8->content + 4)
                                    );
                  uVar4 = DirectWireValue<unsigned_short>::get
                                    ((DirectWireValue<unsigned_short> *)((long)&pwVar8->content + 6)
                                    );
                  if (uVar4 != 0) {
                    __range6 = (Range<unsigned_int> *)(_p792 + 1);
                    ___end6 = kj::zeroTo<unsigned_int>(_kjCondition_5._28_4_);
                    i_2 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end6);
                    local_1f8 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end6);
                    while (bVar1 = kj::Range<unsigned_int>::Iterator::operator==
                                             ((Iterator *)&i_2,&local_1f8),
                          ((bVar1 ^ 0xffU) & 1) != 0) {
                      kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_2);
                      __range6 = __range6 + uVar3;
                      ___end7 = kj::zeroTo<unsigned_int>((uint)uVar4);
                      j = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end7);
                      local_218 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end7);
                      while (bVar1 = kj::Range<unsigned_int>::Iterator::operator==
                                               ((Iterator *)&j,&local_218),
                            ((bVar1 ^ 0xffU) & 1) != 0) {
                        kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&j);
                        MVar12 = totalSize((SegmentReader *)ref_local,(WirePointer *)__range6,
                                           _kjCondition._36_4_);
                        f_7.exception = (Exception *)MVar12.wordCount;
                        MessageSizeCounts::operator+=
                                  ((MessageSizeCounts *)&segment_local,(MessageSizeCounts *)&f_7);
                        __range6 = __range6 + 1;
                        kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&j);
                      }
                      kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_2);
                    }
                  }
                }
                else {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_int&>&,char_const(&)[319]>
                            ((Fault *)&pointerCount,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x368,FAILED,"actualSize <= wordCount",
                             "_kjCondition,\"Struct list pointer\'s elements overran size. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                             ,(DebugComparison<unsigned_long_&,_unsigned_int_&> *)local_1c0,
                             (char (*) [319])
                             "Struct list pointer\'s elements overran size. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                            );
                  kj::_::Debug::Fault::~Fault((Fault *)&pointerCount);
                }
              }
              else {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[54]>
                          ((Fault *)&actualSize,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x360,FAILED,"elementTag->kind() == WirePointer::STRUCT",
                           "_kjCondition,\"Don\'t know how to handle non-STRUCT inline composite.\""
                           ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                             *)local_178,
                           (char (*) [54])"Don\'t know how to handle non-STRUCT inline composite.");
                kj::_::Debug::Fault::~Fault((Fault *)&actualSize);
              }
            }
            else {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                        ((Fault *)&elementTag,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x358,FAILED,
                         "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                         "_kjCondition,\"Message contained out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                         ,(DebugExpression<bool> *)((long)&f_4.exception + 3),
                         (char (*) [320])
                         "Message contained out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                        );
              kj::_::Debug::Fault::~Fault((Fault *)&elementTag);
            }
          }
          break;
        case FAR:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    (&f_8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x385,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                     (char (*) [24])"Unexpected FAR pointer.");
          kj::_::Debug::Fault::~Fault(&f_8);
          break;
        case OTHER:
          bVar1 = WirePointer::isCapability(pWStack_28);
          if (bVar1) {
            result.wordCount._0_4_ = (int)result.wordCount + 1;
          }
          else {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                      (&local_240,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x38d,FAILED,(char *)0x0,"\"Unknown pointer type.\"",
                       (char (*) [22])"Unknown pointer type.");
            kj::_::Debug::Fault::~Fault(&local_240);
          }
        }
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[30]>
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x312,FAILED,"nestingLimit > 0","_kjCondition,\"Message is too deeply-nested.\"",
                 (DebugComparison<int_&,_int> *)local_58,
                 (char (*) [30])"Message is too deeply-nested.");
      kj::_::Debug::Fault::~Fault(&local_70);
    }
  }
  MVar12.capCount = (int)result.wordCount;
  MVar12.wordCount = (WordCountN<61,_uint64_t>)segment_local;
  MVar12._12_4_ = 0;
  return MVar12;
}

Assistant:

static MessageSizeCounts totalSize(
      SegmentReader* segment, const WirePointer* ref, int nestingLimit) {
    // Compute the total size of the object pointed to, not counting far pointer overhead.

    MessageSizeCounts result = { ZERO * WORDS, 0 };

    if (ref->isNull()) {
      return result;
    }

    KJ_REQUIRE(nestingLimit > 0, "Message is too deeply-nested.") {
      return result;
    }
    --nestingLimit;

    const word* ptr;
    KJ_IF_SOME(p, followFars(ref, ref->target(segment), segment)) {
      ptr = &p;
    } else {
      return result;
    }

    switch (ref->kind()) {
      case WirePointer::STRUCT: {
        KJ_REQUIRE(boundsCheck(segment, ptr, ref->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer. "
                   OUT_OF_BOUNDS_ERROR_DETAIL) {
          return result;
        }
        result.addWords(ref->structRef.wordSize());

        const WirePointer* pointerSection =
            reinterpret_cast<const WirePointer*>(ptr + ref->structRef.dataSize.get());
        for (auto i: kj::zeroTo(ref->structRef.ptrCount.get())) {
          result += totalSize(segment, pointerSection + i, nestingLimit);
        }
        break;
      }
      case WirePointer::LIST: {
        switch (ref->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto totalWords = roundBitsUpToWords(
                upgradeBound<uint64_t>(ref->listRef.elementCount()) *
                dataBitsPerElement(ref->listRef.elementSize()));
            KJ_REQUIRE(boundsCheck(segment, ptr, totalWords),
                       "Message contained out-of-bounds list pointer. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }
            result.addWords(totalWords);
            break;
          }
          case ElementSize::POINTER: {
            auto count = ref->listRef.elementCount() * (POINTERS / ELEMENTS);

            KJ_REQUIRE(boundsCheck(segment, ptr, count * WORDS_PER_POINTER),
                       "Message contained out-of-bounds list pointer. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }

            result.addWords(count * WORDS_PER_POINTER);

            for (auto i: kj::zeroTo(count)) {
              result += totalSize(segment, reinterpret_cast<const WirePointer*>(ptr) + i,
                                  nestingLimit);
            }
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            auto wordCount = ref->listRef.inlineCompositeWordCount();
            KJ_REQUIRE(boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                       "Message contained out-of-bounds list pointer. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }

            const WirePointer* elementTag = reinterpret_cast<const WirePointer*>(ptr);
            auto count = elementTag->inlineCompositeListElementCount();

            KJ_REQUIRE(elementTag->kind() == WirePointer::STRUCT,
                       "Don't know how to handle non-STRUCT inline composite.") {
              return result;
            }

            auto actualSize = elementTag->structRef.wordSize() / ELEMENTS *
                              upgradeBound<uint64_t>(count);
            KJ_REQUIRE(actualSize <= wordCount,
                       "Struct list pointer's elements overran size. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }

            // We count the actual size rather than the claimed word count because that's what
            // we'll end up with if we make a copy.
            result.addWords(actualSize + POINTER_SIZE_IN_WORDS);

            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            if (pointerCount > ZERO * POINTERS) {
              const word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  result += totalSize(segment, reinterpret_cast<const WirePointer*>(pos),
                                      nestingLimit);
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        if (ref->isCapability()) {
          result.capCount++;
        } else {
          KJ_FAIL_REQUIRE("Unknown pointer type.") { break; }
        }
        break;
    }

    return result;
  }